

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

_Bool MoveToColors(SolStack_t *srcStackPtr)

{
  ulong uVar1;
  Card_t card2;
  _Bool _Var2;
  Card_t *pCVar3;
  Card_t *pCVar4;
  
  pCVar3 = stk_CTopCard(srcStackPtr);
  if (pCVar3 == (Card_t *)0x0) {
    return false;
  }
  uVar1._0_4_ = pCVar3->m_type;
  uVar1._4_4_ = pCVar3->m_color;
  card2 = *pCVar3;
  pCVar4 = stk_CTopCard(ColorStacks + (uVar1 >> 0x20));
  if (pCVar4 == (Card_t *)0x0) {
    if ((undefined4)uVar1 != 1) {
      return false;
    }
  }
  else {
    _Var2 = card_IsOneLess(*pCVar4,card2);
    if (!_Var2) {
      return false;
    }
  }
  _Var2 = stk_MoveCardFromTo(srcStackPtr,ColorStacks + pCVar3->m_color);
  return _Var2;
}

Assistant:

static bool MoveToColors(SolStack_t* srcStackPtr)
{
  const Card_t* srcCardPtr = stk_CTopCard(srcStackPtr);

  if (srcCardPtr && IsCardMovableToColors(*srcCardPtr)) {
    return stk_MoveCardFromTo(srcStackPtr, &ColorStacks[srcCardPtr->m_color]);
  }
  return false;
}